

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
testing::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,char *message)

{
  char *__s;
  allocator<char> local_41;
  string local_40;
  
  __s = "(null)";
  if (message != (char *)0x0) {
    __s = message;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  PushTrace(this,file,line,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

ScopedTrace(const char* file, int line, const char* message) {
    PushTrace(file, line, message ? message : "(null)");
  }